

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O0

int vardata_add_feature(vardata *data,char *name,char *description)

{
  int iVar1;
  vardata_feature *pvVar2;
  char *local_70;
  vardata_feature new;
  int res;
  char *description_local;
  char *name_local;
  vardata *data_local;
  
  if (data->validated != 0) {
    abort();
  }
  iVar1 = symtab_put(data->symtab,name,0,data->featuresnum);
  if (iVar1 == -1) {
    data_local._4_4_ = -1;
  }
  else {
    new.conflictsmax = data->featuresnum;
    memset(&local_70,0,0x40);
    local_70 = strdup(name);
    if (description != (char *)0x0) {
      new.name = strdup(description);
    }
    if (data->featuresmax <= data->featuresnum) {
      if (data->featuresmax == 0) {
        data->featuresmax = 0x10;
      }
      else {
        data->featuresmax = data->featuresmax << 1;
      }
      pvVar2 = (vardata_feature *)realloc(data->features,(long)data->featuresmax << 6);
      data->features = pvVar2;
    }
    iVar1 = data->featuresnum;
    data->featuresnum = iVar1 + 1;
    memcpy(data->features + iVar1,&local_70,0x40);
    data_local._4_4_ = new.conflictsmax;
  }
  return data_local._4_4_;
}

Assistant:

int vardata_add_feature(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_FEATURE, data->featuresnum) == -1)
		return -1;
	int res = data->featuresnum;
	struct vardata_feature new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->features, new);
	return res;
}